

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__psd_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                     int bpc)

{
  byte bVar1;
  ushort uVar2;
  stbi_uc sVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  stbi__uint32 sVar11;
  uint uVar12;
  int iVar13;
  char *pcVar14;
  stbi__uint16 *data;
  stbi_uc *psVar15;
  uint x_00;
  long lVar16;
  stbi__uint16 *psVar17;
  int iVar18;
  uint y_00;
  ulong uVar19;
  long in_FS_OFFSET;
  float fVar20;
  float fVar21;
  stbi__uint16 *local_78;
  
  iVar4 = stbi__get16be(s);
  uVar5 = stbi__get16be(s);
  if ((uVar5 | iVar4 << 0x10) != 0x38425053) {
    pcVar14 = "not PSD";
    goto LAB_0010b889;
  }
  iVar4 = stbi__get16be(s);
  if (iVar4 != 1) {
    pcVar14 = "wrong version";
    goto LAB_0010b889;
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0010b805:
    s->img_buffer = s->img_buffer + 6;
  }
  else {
    iVar4 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (5 < iVar4) goto LAB_0010b805;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,6 - iVar4);
  }
  uVar5 = stbi__get16be(s);
  if (0x10 < uVar5) {
    pcVar14 = "wrong channel count";
    goto LAB_0010b889;
  }
  iVar4 = stbi__get16be(s);
  iVar4 = iVar4 * 0x10000;
  iVar6 = stbi__get16be(s);
  y_00 = iVar6 + iVar4;
  iVar7 = stbi__get16be(s);
  iVar8 = stbi__get16be(s);
  if ((int)y_00 < 0x1000001) {
    iVar7 = iVar7 * 0x10000;
    x_00 = iVar8 + iVar7;
    if ((int)x_00 < 0x1000001) {
      iVar9 = stbi__get16be(s);
      if ((iVar9 != 8) && (iVar9 != 0x10)) {
        pcVar14 = "unsupported bit depth";
        goto LAB_0010b889;
      }
      iVar10 = stbi__get16be(s);
      if (iVar10 != 3) {
        pcVar14 = "wrong color format";
        goto LAB_0010b889;
      }
      sVar11 = stbi__get32be(s);
      stbi__skip(s,sVar11);
      sVar11 = stbi__get32be(s);
      stbi__skip(s,sVar11);
      sVar11 = stbi__get32be(s);
      stbi__skip(s,sVar11);
      uVar12 = stbi__get16be(s);
      if (1 < uVar12) {
        pcVar14 = "bad compression";
        goto LAB_0010b889;
      }
      iVar10 = stbi__mad3sizes_valid(4,x_00,y_00,0);
      if (iVar10 != 0) {
        if (((bpc == 0x10) && (iVar9 == 0x10)) && (uVar12 == 0)) {
          data = (stbi__uint16 *)stbi__malloc_mad3(8,x_00,y_00,0);
          ri->bits_per_channel = 0x10;
        }
        else {
          data = (stbi__uint16 *)malloc((long)(int)(y_00 * x_00 * 4));
        }
        if (data != (stbi__uint16 *)0x0) {
          iVar10 = x_00 * y_00;
          if (uVar12 == 0) {
            iVar18 = (iVar6 + iVar4) * (iVar8 + iVar7);
            uVar19 = 0;
            psVar17 = data;
            local_78 = data;
            do {
              if (uVar19 < uVar5) {
                if (ri->bits_per_channel == 0x10) {
                  if (0 < iVar10) {
                    lVar16 = 0;
                    do {
                      iVar13 = stbi__get16be(s);
                      psVar17[lVar16 * 4] = (stbi__uint16)iVar13;
                      lVar16 = lVar16 + 1;
                    } while (iVar18 != (int)lVar16);
                  }
                }
                else if (iVar9 == 0x10) {
                  if (0 < iVar10) {
                    lVar16 = 0;
                    do {
                      iVar13 = stbi__get16be(s);
                      *(char *)(local_78 + lVar16 * 2) = (char)((uint)iVar13 >> 8);
                      lVar16 = lVar16 + 1;
                    } while (iVar18 != (int)lVar16);
                  }
                }
                else if (0 < iVar10) {
                  lVar16 = 0;
                  do {
                    psVar15 = s->img_buffer;
                    if (psVar15 < s->img_buffer_end) {
LAB_0010bb9a:
                      s->img_buffer = psVar15 + 1;
                      sVar3 = *psVar15;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        psVar15 = s->img_buffer;
                        goto LAB_0010bb9a;
                      }
                      sVar3 = '\0';
                    }
                    *(stbi_uc *)(local_78 + lVar16 * 2) = sVar3;
                    lVar16 = lVar16 + 1;
                  } while (iVar18 != (int)lVar16);
                }
              }
              else if (iVar9 == 0x10 && bpc == 0x10) {
                if (0 < iVar10) {
                  lVar16 = 0;
                  do {
                    psVar17[lVar16 * 4] = -(ushort)(uVar19 == 3);
                    lVar16 = lVar16 + 1;
                  } while (iVar18 != (int)lVar16);
                }
              }
              else if (0 < iVar10) {
                lVar16 = 0;
                do {
                  *(char *)(local_78 + lVar16 * 2) = -(uVar19 == 3);
                  lVar16 = lVar16 + 1;
                } while (iVar18 != (int)lVar16);
              }
              uVar19 = uVar19 + 1;
              local_78 = (stbi__uint16 *)((long)local_78 + 1);
              psVar17 = psVar17 + 1;
            } while (uVar19 != 4);
          }
          else {
            stbi__skip(s,uVar5 * y_00 * 2);
            uVar19 = 0;
            psVar17 = data;
            do {
              if (uVar19 < uVar5) {
                iVar9 = stbi__psd_decode_rle(s,(stbi_uc *)(uVar19 + (long)data),iVar10);
                if (iVar9 == 0) {
                  free(data);
                  pcVar14 = "corrupt";
                  goto LAB_0010b889;
                }
              }
              else if (0 < iVar10) {
                lVar16 = 0;
                do {
                  *(char *)(psVar17 + lVar16 * 2) = -(uVar19 == 3);
                  lVar16 = lVar16 + 1;
                } while ((iVar6 + iVar4) * (iVar8 + iVar7) != (int)lVar16);
              }
              uVar19 = uVar19 + 1;
              psVar17 = (stbi__uint16 *)((long)psVar17 + 1);
            } while (uVar19 != 4);
          }
          if (3 < uVar5) {
            if (ri->bits_per_channel == 0x10) {
              if (0 < iVar10) {
                uVar19 = 0;
                do {
                  uVar2 = data[uVar19 * 4 + 3];
                  if ((uVar2 != 0) && (uVar2 != 0xffff)) {
                    fVar21 = 1.0 / ((float)uVar2 / 65535.0);
                    fVar20 = (1.0 - fVar21) * 65535.0;
                    data[uVar19 * 4] =
                         (stbi__uint16)(int)((float)data[uVar19 * 4] * fVar21 + fVar20);
                    data[uVar19 * 4 + 1] =
                         (stbi__uint16)(int)((float)data[uVar19 * 4 + 1] * fVar21 + fVar20);
                    data[uVar19 * 4 + 2] =
                         (stbi__uint16)(int)((float)data[uVar19 * 4 + 2] * fVar21 + fVar20);
                  }
                  uVar19 = uVar19 + 1;
                } while ((uint)((iVar6 + iVar4) * (iVar8 + iVar7)) != uVar19);
              }
            }
            else if (0 < iVar10) {
              uVar19 = 0;
              do {
                bVar1 = *(byte *)((long)data + uVar19 * 4 + 3);
                if ((bVar1 != 0) && (bVar1 != 0xff)) {
                  fVar21 = 1.0 / ((float)bVar1 / 255.0);
                  fVar20 = (1.0 - fVar21) * 255.0;
                  *(char *)(data + uVar19 * 2) =
                       (char)(int)((float)(byte)data[uVar19 * 2] * fVar21 + fVar20);
                  *(char *)((long)data + uVar19 * 4 + 1) =
                       (char)(int)((float)*(byte *)((long)data + uVar19 * 4 + 1) * fVar21 + fVar20);
                  *(char *)(data + uVar19 * 2 + 1) =
                       (char)(int)((float)(byte)data[uVar19 * 2 + 1] * fVar21 + fVar20);
                }
                uVar19 = uVar19 + 1;
              } while ((uint)((iVar6 + iVar4) * (iVar8 + iVar7)) != uVar19);
            }
          }
          if ((req_comp & 0xfffffffbU) != 0) {
            if (ri->bits_per_channel == 0x10) {
              data = stbi__convert_format16(data,4,req_comp,x_00,y_00);
            }
            else {
              data = (stbi__uint16 *)stbi__convert_format((uchar *)data,4,req_comp,x_00,y_00);
            }
            if (data == (stbi__uint16 *)0x0) {
              return (void *)0x0;
            }
          }
          if (comp != (int *)0x0) {
            *comp = 4;
          }
          *y = y_00;
          *x = x_00;
          return data;
        }
        pcVar14 = "outofmem";
        goto LAB_0010b889;
      }
    }
  }
  pcVar14 = "too large";
LAB_0010b889:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar14;
  return (void *)0x0;
}

Assistant:

static void *stbi__psd_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   int pixelCount;
   int channelCount, compression;
   int channel, i;
   int bitdepth;
   int w,h;
   stbi_uc *out;
   STBI_NOTUSED(ri);

   // Check identifier
   if (stbi__get32be(s) != 0x38425053)   // "8BPS"
      return stbi__errpuc("not PSD", "Corrupt PSD image");

   // Check file type version.
   if (stbi__get16be(s) != 1)
      return stbi__errpuc("wrong version", "Unsupported version of PSD image");

   // Skip 6 reserved bytes.
   stbi__skip(s, 6 );

   // Read the number of channels (R, G, B, A, etc).
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16)
      return stbi__errpuc("wrong channel count", "Unsupported number of channels in PSD image");

   // Read the rows and columns of the image.
   h = stbi__get32be(s);
   w = stbi__get32be(s);

   if (h > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (w > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   // Make sure the depth is 8 bits.
   bitdepth = stbi__get16be(s);
   if (bitdepth != 8 && bitdepth != 16)
      return stbi__errpuc("unsupported bit depth", "PSD bit depth is not 8 or 16 bit");

   // Make sure the color mode is RGB.
   // Valid options are:
   //   0: Bitmap
   //   1: Grayscale
   //   2: Indexed color
   //   3: RGB color
   //   4: CMYK color
   //   7: Multichannel
   //   8: Duotone
   //   9: Lab color
   if (stbi__get16be(s) != 3)
      return stbi__errpuc("wrong color format", "PSD is not in RGB color format");

   // Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
   stbi__skip(s,stbi__get32be(s) );

   // Skip the image resources.  (resolution, pen tool paths, etc)
   stbi__skip(s, stbi__get32be(s) );

   // Skip the reserved data.
   stbi__skip(s, stbi__get32be(s) );

   // Find out if the data is compressed.
   // Known values:
   //   0: no compression
   //   1: RLE compressed
   compression = stbi__get16be(s);
   if (compression > 1)
      return stbi__errpuc("bad compression", "PSD has an unknown compression format");

   // Check size
   if (!stbi__mad3sizes_valid(4, w, h, 0))
      return stbi__errpuc("too large", "Corrupt PSD");

   // Create the destination image.

   if (!compression && bitdepth == 16 && bpc == 16) {
      out = (stbi_uc *) stbi__malloc_mad3(8, w, h, 0);
      ri->bits_per_channel = 16;
   } else
      out = (stbi_uc *) stbi__malloc(4 * w*h);

   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   pixelCount = w*h;

   // Initialize the data to zero.
   //memset( out, 0, pixelCount * 4 );

   // Finally, the image data.
   if (compression) {
      // RLE as used by .PSD and .TIFF
      // Loop until you get the number of unpacked bytes you are expecting:
      //     Read the next source byte into n.
      //     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
      //     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
      //     Else if n is 128, noop.
      // Endloop

      // The RLE-compressed data is preceded by a 2-byte data count for each row in the data,
      // which we're going to just skip.
      stbi__skip(s, h * channelCount * 2 );

      // Read the RLE data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out+channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = (channel == 3 ? 255 : 0);
         } else {
            // Read the RLE data.
            if (!stbi__psd_decode_rle(s, p, pixelCount)) {
               STBI_FREE(out);
               return stbi__errpuc("corrupt", "bad RLE data");
            }
         }
      }

   } else {
      // We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
      // where each channel consists of an 8-bit (or 16-bit) value for each pixel in the image.

      // Read the data by channel.
      for (channel = 0; channel < 4; channel++) {
         if (channel >= channelCount) {
            // Fill this channel with default data.
            if (bitdepth == 16 && bpc == 16) {
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               stbi__uint16 val = channel == 3 ? 65535 : 0;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = val;
            } else {
               stbi_uc *p = out+channel;
               stbi_uc val = channel == 3 ? 255 : 0;
               for (i = 0; i < pixelCount; i++, p += 4)
                  *p = val;
            }
         } else {
            if (ri->bits_per_channel == 16) {    // output bpc
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = (stbi__uint16) stbi__get16be(s);
            } else {
               stbi_uc *p = out+channel;
               if (bitdepth == 16) {  // input bpc
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = (stbi_uc) (stbi__get16be(s) >> 8);
               } else {
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = stbi__get8(s);
               }
            }
         }
      }
   }

   // remove weird white matte from PSD
   if (channelCount >= 4) {
      if (ri->bits_per_channel == 16) {
         for (i=0; i < w*h; ++i) {
            stbi__uint16 *pixel = (stbi__uint16 *) out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 65535) {
               float a = pixel[3] / 65535.0f;
               float ra = 1.0f / a;
               float inv_a = 65535.0f * (1 - ra);
               pixel[0] = (stbi__uint16) (pixel[0]*ra + inv_a);
               pixel[1] = (stbi__uint16) (pixel[1]*ra + inv_a);
               pixel[2] = (stbi__uint16) (pixel[2]*ra + inv_a);
            }
         }
      } else {
         for (i=0; i < w*h; ++i) {
            unsigned char *pixel = out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 255) {
               float a = pixel[3] / 255.0f;
               float ra = 1.0f / a;
               float inv_a = 255.0f * (1 - ra);
               pixel[0] = (unsigned char) (pixel[0]*ra + inv_a);
               pixel[1] = (unsigned char) (pixel[1]*ra + inv_a);
               pixel[2] = (unsigned char) (pixel[2]*ra + inv_a);
            }
         }
      }
   }

   // convert to desired output format
   if (req_comp && req_comp != 4) {
      if (ri->bits_per_channel == 16)
         out = (stbi_uc *) stbi__convert_format16((stbi__uint16 *) out, 4, req_comp, w, h);
      else
         out = stbi__convert_format(out, 4, req_comp, w, h);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   if (comp) *comp = 4;
   *y = h;
   *x = w;

   return out;
}